

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::SADSkipx4Test_ShortSrc_Test::TestBody(SADSkipx4Test_ShortSrc_Test *this)

{
  anon_unknown.dwarf_1c2f005::SADSkipx4Test_ShortSrc_Test::TestBody
            ((SADSkipx4Test_ShortSrc_Test *)(this + -8));
  return;
}

Assistant:

TEST_P(SADSkipx4Test, ShortSrc) {
  int tmp_stride = source_stride_;
  source_stride_ >>= 1;
  int test_count = 1000;
  while (test_count > 0) {
    FillRandom(source_data_, source_stride_);
    FillRandom(GetReference(0), reference_stride_);
    FillRandom(GetReference(1), reference_stride_);
    FillRandom(GetReference(2), reference_stride_);
    FillRandom(GetReference(3), reference_stride_);
    CheckSADs();
    test_count -= 1;
  }
  source_stride_ = tmp_stride;
}